

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_stats.h
# Opt level: O0

void sylvan_stats_count(size_t counter)

{
  size_t counter_local;
  
  return;
}

Assistant:

static inline void
sylvan_stats_count(size_t counter)
{
#ifdef __ELF__
    sylvan_stats.counters[counter]++;
#else
    sylvan_stats_t *sylvan_stats = (sylvan_stats_t*)pthread_getspecific(sylvan_stats_key);
    sylvan_stats->counters[counter]++;
#endif
}